

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Time.cpp
# Opt level: O0

void axl::sys::getAbsTimespecFromTimeout(uint_t timeout,timespec *tspec)

{
  ulong uVar1;
  long *in_RSI;
  uint in_EDI;
  uint64_t nsec;
  int result;
  timespec *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  __wrap_clock_gettime
            ((clockid_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20),in_stack_ffffffffffffffd8);
  uVar1 = in_RSI[1] + ((ulong)in_EDI % 1000) * 1000000;
  *in_RSI = (ulong)in_EDI / 1000 + uVar1 / 1000000000 + *in_RSI;
  in_RSI[1] = uVar1 % 1000000000;
  return;
}

Assistant:

void
getAbsTimespecFromTimeout(
	uint_t timeout,
	timespec* tspec
) {
#if (_AXL_OS_DARWIN)
	timeval tval;
	gettimeofday(&tval, NULL);
	tspec->tv_sec = tval.tv_sec;
	tspec->tv_nsec = tval.tv_usec * 1000;
#else
	int result = clock_gettime(CLOCK_REALTIME, tspec);
	ASSERT(result == 0);
#endif

	uint64_t nsec = tspec->tv_nsec + (uint64_t)(timeout % 1000) * 1000000;
	tspec->tv_sec += timeout / 1000 + nsec / 1000000000ULL;
	tspec->tv_nsec = nsec % 1000000000ULL;
}